

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O3

Vec_Int_t * Unm_ManComputePairs(Unm_Man_t *p,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *__ptr;
  Hash_IntMan_t *p_01;
  Vec_Int_t *__ptr_00;
  int *piVar3;
  Vec_Int_t *__ptr_01;
  Gia_Man_t *pGVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong in_R8;
  int iVar13;
  int iData0;
  int Entry;
  long lVar14;
  long lVar15;
  int local_74;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 0x10;
  piVar2 = (int *)malloc(0x40);
  __ptr->pArray = piVar2;
  __ptr->nSize = 1;
  *piVar2 = 0;
  p_01 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar10 = 1099;
  while( true ) {
    do {
      uVar8 = uVar10;
      uVar10 = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (uVar10 < 9) break;
    iVar5 = 5;
    while (uVar10 % (iVar5 - 2U) != 0) {
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar10 < uVar1) goto LAB_0071bb56;
    }
  }
LAB_0071bb56:
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar8) {
    uVar1 = uVar10;
  }
  __ptr_00->nCap = uVar1;
  piVar3 = (int *)malloc((long)(int)uVar1 << 2);
  __ptr_00->pArray = piVar3;
  __ptr_00->nSize = uVar10;
  local_74 = 0;
  memset(piVar3,0,(long)(int)uVar10 << 2);
  p_01->vTable = __ptr_00;
  __ptr_01 = (Vec_Int_t *)malloc(0x10);
  __ptr_01->nCap = 0x1130;
  piVar3 = (int *)malloc(0x44c0);
  __ptr_01->pArray = piVar3;
  p_01->vObjs = __ptr_01;
  piVar3[0] = 0;
  piVar3[1] = 0;
  piVar3[2] = 0;
  piVar3[3] = 0;
  __ptr_01->nSize = 4;
  p_01->nRefs = 1;
  Gia_ManSetRefsMapped(p->pGia);
  iVar7 = (int)in_R8;
  pGVar4 = p->pGia;
  iVar5 = 0;
  if (1 < pGVar4->nObjs) {
    iVar5 = 0;
    lVar14 = 1;
    local_74 = 0;
    do {
      pVVar6 = pGVar4->vMapping;
      if (pVVar6->nSize <= lVar14) goto LAB_0071bf7f;
      uVar10 = pVVar6->pArray[lVar14];
      if ((ulong)uVar10 != 0) {
        if (((int)uVar10 < 0) || ((uint)pVVar6->nSize <= uVar10)) {
LAB_0071bf7f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar7 = pVVar6->pArray[uVar10];
        p->vLeaves->nSize = 0;
        lVar9 = (long)pVVar6->nSize;
        if (lVar9 <= lVar14) goto LAB_0071bf7f;
        iVar5 = iVar5 + ((iVar7 + -1) * iVar7) / 2;
        lVar15 = 0;
        while( true ) {
          piVar2 = pVVar6->pArray;
          lVar11 = (long)piVar2[lVar14];
          if ((lVar11 < 0) || ((uint)lVar9 <= (uint)piVar2[lVar14])) goto LAB_0071bf7f;
          if (piVar2[lVar11] <= lVar15) break;
          if (1 < pGVar4->pRefs[piVar2[lVar11 + lVar15 + 1]]) {
            Vec_IntPush(p->vLeaves,piVar2[lVar11 + lVar15 + 1]);
            pGVar4 = p->pGia;
          }
          lVar15 = lVar15 + 1;
          pVVar6 = pGVar4->vMapping;
          lVar9 = (long)pVVar6->nSize;
          if (lVar9 <= lVar14) goto LAB_0071bf7f;
        }
        pVVar6 = p->vLeaves;
        iVar7 = pVVar6->nSize;
        if (1 < iVar7) {
          local_74 = local_74 + ((uint)((iVar7 + -1) * iVar7) >> 1);
          lVar15 = 1;
          lVar9 = 0;
          do {
            lVar12 = lVar9 + 1;
            lVar11 = (long)iVar7;
            if (lVar12 < lVar11) {
              lVar11 = lVar15;
              iVar13 = pVVar6->pArray[lVar9];
              do {
                iVar7 = pVVar6->pArray[lVar11];
                iData0 = iVar7;
                if (iVar13 < iVar7) {
                  iData0 = iVar13;
                }
                if (iVar7 < iVar13) {
                  iVar7 = iVar13;
                }
                uVar10 = Hash_Int2ManInsert(p_01,iData0,iVar7,(int)pVVar6->pArray);
                if ((int)uVar10 < 0) {
LAB_0071bf03:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                }
                uVar8 = uVar10 * 4;
                uVar1 = __ptr_01->nSize;
                if (uVar1 == uVar8 || SBORROW4(uVar1,uVar8) != (int)(uVar1 + uVar10 * -4) < 0)
                goto LAB_0071bf03;
                iVar13 = __ptr_01->pArray[(ulong)uVar8 + 2];
                in_R8 = (ulong)(iVar13 + 1U);
                __ptr_01->pArray[(ulong)uVar8 + 2] = iVar13 + 1U;
                Entry = (int)lVar14;
                if (iVar13 == 1) {
                  if (__ptr->nSize <= (int)uVar10) {
                    __assert_fail("Num < Vec_IntSize(vNum2Obj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                  ,0xbf,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                  }
                  Vec_IntPush(p_00,__ptr->pArray[uVar10]);
                  Vec_IntPush(p_00,iData0);
                  Vec_IntPush(p_00,iVar7);
LAB_0071bdfa:
                  Vec_IntPush(p_00,Entry);
                  Vec_IntPush(p_00,iData0);
                  pVVar6 = p_00;
                  Entry = iVar7;
                }
                else {
                  if (iVar13 != 0) goto LAB_0071bdfa;
                  uVar8 = uVar1 + 3;
                  if (-1 < (int)uVar1) {
                    uVar8 = uVar1;
                  }
                  if (uVar10 != ((int)uVar8 >> 2) - 1U) {
                    __assert_fail("Num == Hash_IntManEntryNum(pHash)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                  ,0xb8,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                  }
                  pVVar6 = __ptr;
                  if (uVar10 != __ptr->nSize) {
                    __assert_fail("Num == Vec_IntSize(vNum2Obj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                  ,0xb9,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                  }
                }
                Vec_IntPush(pVVar6,Entry);
                lVar11 = lVar11 + 1;
                pVVar6 = p->vLeaves;
                iVar7 = pVVar6->nSize;
                iVar13 = iData0;
              } while ((int)lVar11 < iVar7);
              lVar11 = (long)iVar7;
            }
            lVar15 = lVar15 + 1;
            lVar9 = lVar12;
          } while (lVar12 < lVar11);
          pGVar4 = p->pGia;
        }
      }
      iVar7 = (int)in_R8;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pGVar4->nObjs);
    piVar2 = __ptr->pArray;
  }
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(__ptr);
  if (fVerbose != 0) {
    Unm_ManPrintPairStats(p_01,iVar5,local_74,p_00->nSize / 3,iVar7);
  }
  if (__ptr_01->pArray != (int *)0x0) {
    free(__ptr_01->pArray);
  }
  free(__ptr_01);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  free(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Unm_ManComputePairs( Unm_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNum2Obj = Vec_IntStart( 1 );
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    int nTotal = 0, nPairs0 = 0, nPairs = 0;
    int i, k, j, FanK, FanJ, Num, nRefs;
    Gia_ManSetRefsMapped( p->pGia );
    Gia_ManForEachLut( p->pGia, i )
    {
        nTotal += Gia_ObjLutSize(p->pGia, i) * (Gia_ObjLutSize(p->pGia, i) - 1) / 2;
        pObj = Gia_ManObj( p->pGia, i );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, i, Num, k )
            if ( Gia_ObjRefNumId(p->pGia, Num) > 1 )
                Vec_IntPush( p->vLeaves, Num );
        if ( Vec_IntSize(p->vLeaves) < 2 )
            continue;
        nPairs0 += Vec_IntSize(p->vLeaves) * (Vec_IntSize(p->vLeaves) - 1) / 2;
        // enumerate pairs
        Vec_IntForEachEntry( p->vLeaves, FanK, k )
        Vec_IntForEachEntryStart( p->vLeaves, FanJ, j, k+1 )
        {
            if ( FanK > FanJ )
                ABC_SWAP( int, FanK, FanJ );
            Num = Hash_Int2ManInsert( pHash, FanK, FanJ, 0 );
            nRefs = Hash_Int2ObjInc(pHash, Num);
            if ( nRefs == 0 )
            {
                assert( Num == Hash_IntManEntryNum(pHash) );
                assert( Num == Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vNum2Obj, i );
                continue;
            }
            if ( nRefs == 1 )
            {
                assert( Num < Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vPairs, Vec_IntEntry(vNum2Obj, Num) );
                Vec_IntPush( vPairs, FanK );
                Vec_IntPush( vPairs, FanJ);
            }
            Vec_IntPush( vPairs, i );
            Vec_IntPush( vPairs, FanK );
            Vec_IntPush( vPairs, FanJ );
        }
    }
    Vec_IntFree( vNum2Obj );
    if ( fVerbose )
        nPairs = Unm_ManPrintPairStats( pHash, nTotal, nPairs0, Vec_IntSize(vPairs) / 3, 0 );
    Hash_IntManStop( pHash );
    return vPairs;    
}